

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

char * __thiscall
fmt::v11::detail::format_string_checker<char,_2,_0,_false>::on_format_specs
          (format_string_checker<char,_2,_0,_false> *this,int id,char *begin,char *end)

{
  size_t *psVar1;
  char *pcVar2;
  
  pcVar2 = (this->context_).super_parse_context<char>.fmt_.data_;
  (this->context_).super_parse_context<char>.fmt_.data_ = begin;
  psVar1 = &(this->context_).super_parse_context<char>.fmt_.size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)begin));
  if (1 < (uint)id) {
    for (; (pcVar2 = end, begin != end && (pcVar2 = begin, *begin != '}')); begin = begin + 1) {
    }
    return pcVar2;
  }
  pcVar2 = (*this->parse_funcs_[(uint)id])(&(this->context_).super_parse_context<char>);
  return pcVar2;
}

Assistant:

FMT_CONSTEXPR auto on_format_specs(int id, const Char* begin, const Char* end)
      -> const Char* {
    context_.advance_to(begin);
    if (id >= 0 && id < NUM_ARGS) return parse_funcs_[id](context_);
    while (begin != end && *begin != '}') ++begin;
    return begin;
  }